

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double * normal_01_vector(int n,int *seed)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  lVar3 = (long)n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar4 = lVar3 * 8;
  }
  pdVar1 = (double *)operator_new__(uVar4);
  if (n == 1) {
    pdVar2 = r8vec_uniform_01_new(2,seed);
    dVar5 = log(*pdVar2);
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = cos(pdVar2[1] * 6.283185307179586);
    *pdVar1 = dVar6 * dVar5;
  }
  else if ((n & 1U) == 0) {
    pdVar2 = r8vec_uniform_01_new(n,seed);
    if (n < 2) {
      if (pdVar2 == (double *)0x0) {
        return pdVar1;
      }
    }
    else {
      uVar4 = 0;
      do {
        dVar5 = log(pdVar2[uVar4]);
        dVar5 = dVar5 * -2.0;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar6 = cos(pdVar2[uVar4 + 1] * 6.283185307179586);
        pdVar1[uVar4] = dVar6 * dVar5;
        dVar5 = log(pdVar2[uVar4]);
        dVar5 = dVar5 * -2.0;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar6 = sin(pdVar2[uVar4 + 1] * 6.283185307179586);
        pdVar1[uVar4 + 1] = dVar6 * dVar5;
        uVar4 = uVar4 + 2;
      } while (uVar4 <= n - 2);
    }
  }
  else {
    pdVar2 = r8vec_uniform_01_new(n + 1,seed);
    if (-1 < (int)(n - 3U)) {
      uVar4 = 0;
      do {
        dVar5 = log(pdVar2[uVar4]);
        dVar5 = dVar5 * -2.0;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar6 = cos(pdVar2[uVar4 + 1] * 6.283185307179586);
        pdVar1[uVar4] = dVar6 * dVar5;
        dVar5 = log(pdVar2[uVar4]);
        dVar5 = dVar5 * -2.0;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar6 = sin(pdVar2[uVar4 + 1] * 6.283185307179586);
        pdVar1[uVar4 + 1] = dVar6 * dVar5;
        uVar4 = uVar4 + 2;
      } while (uVar4 <= n - 3U);
    }
    dVar5 = log(pdVar2[lVar3 + -1]);
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = cos(pdVar2[lVar3] * 6.283185307179586);
    pdVar1[lVar3 + -1] = dVar6 * dVar5;
  }
  operator_delete__(pdVar2);
  return pdVar1;
}

Assistant:

double *normal_01_vector ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_01_VECTOR samples the standard normal probability distribution.
//
//  Discussion:
//
//    The standard normal probability distribution function (PDF) has
//    mean 0 and standard deviation 1.
//
//    This routine can generate a vector of values on one call.  It
//    has the feature that it should provide the same results
//    in the same order no matter how we break up the task.
//
//    Before calling this routine, the user may call RANDOM_SEED
//    in order to set the seed of the random number generator.
//
//    The Box-Muller method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of values desired.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double X(N), a sample of the standard normal PDF.
//
//  Local parameters:
//
//    Local, real R(N+1), is used to store some uniform random values.
//    Its dimension is N+1, but really it is only needed to be the
//    smallest even number greater than or equal to N.
//
//    Local, int X_LO, X_HI, records the range of entries of
//    X that we need to compute.  This starts off as 1:N, but is adjusted
//    if we have a saved value that can be immediately stored in X(1),
//    and so on.
//
{
  int i;
  int m;
  const double r8_pi = 3.14159265358979323;
  double *r;
  double *x;
  int x_hi;
  int x_lo;

  x = new double[n];
//
//  Record the range of X we need to fill in.
//
  x_lo = 1;
  x_hi = n;
//
//  If we need just one new value, do that here to avoid null arrays.
//
  if ( x_hi - x_lo + 1 == 1 )
  {
    r = r8vec_uniform_01_new ( 2, seed );

    x[x_hi-1] = sqrt ( -2.0 * log ( r[0] ) ) * cos ( 2.0 * r8_pi * r[1] );

    delete [] r;
  }
//
//  If we require an even number of values, that's easy.
//
  else if ( ( x_hi - x_lo + 1 ) % 2 == 0 )
  {
    m = ( x_hi - x_lo + 1 ) / 2;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-2; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    delete [] r;
  }
//
//  If we require an odd number of values, we generate an even number,
//  and handle the last pair specially, storing one in X(N).
//
  else
  {
    x_hi = x_hi - 1;

    m = ( x_hi - x_lo + 1 ) / 2 + 1;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-4; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    i = 2*m - 2;

    x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );

    delete [] r;
  }

  return x;
}